

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O2

_Bool upb_Clone_MessageValue(void *value,upb_CType value_type,upb_MiniTable *sub,upb_Arena *arena)

{
  void *__src;
  ulong uVar1;
  uint __line;
  void *__dest;
  upb_Message *ptr;
  uintptr_t uVar2;
  char *__assertion;
  size_t size;
  
  if (value_type < (kUpb_CType_Int64|kUpb_CType_UInt32)) {
    if ((0x3beU >> (value_type & 0x1f) & 1) != 0) {
      return true;
    }
    if ((0xc00U >> (value_type & 0x1f) & 1) != 0) {
      __src = *value;
      size = (size_t)*(int *)((long)value + 8);
      __dest = upb_Arena_Malloc(arena,size);
      if (__dest != (void *)0x0) {
        *(void **)value = __dest;
        *(size_t *)((long)value + 8) = size;
        memcpy(__dest,__src,size);
        return true;
      }
      return false;
    }
    if (value_type == kUpb_CType_Message) {
      uVar1 = *value;
      if ((uVar1 & 1) != 0) {
        sub = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
LAB_00250bdd:
        ptr = upb_Message_DeepClone((upb_Message *)(uVar1 & 0xfffffffffffffffe),sub,arena);
        uVar2 = _upb_TaggedMessagePtr_Pack_dont_copy_me__upb_internal_use_only
                          (ptr,(_Bool)((byte)uVar1 & 1));
        *(uintptr_t *)value = uVar2;
        return ptr != (upb_Message *)0x0;
      }
      if (uVar1 != 0) goto LAB_00250bdd;
      __assertion = "source";
      __line = 0x4e;
      goto LAB_00250c3d;
    }
  }
  __assertion = "0";
  __line = 0x56;
LAB_00250c3d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/copy.c"
                ,__line,
                "_Bool upb_Clone_MessageValue(void *, upb_CType, const upb_MiniTable *, upb_Arena *)"
               );
}

Assistant:

static bool upb_Clone_MessageValue(void* value, upb_CType value_type,
                                   const upb_MiniTable* sub, upb_Arena* arena) {
  switch (value_type) {
    case kUpb_CType_Bool:
    case kUpb_CType_Float:
    case kUpb_CType_Int32:
    case kUpb_CType_UInt32:
    case kUpb_CType_Enum:
    case kUpb_CType_Double:
    case kUpb_CType_Int64:
    case kUpb_CType_UInt64:
      return true;
    case kUpb_CType_String:
    case kUpb_CType_Bytes: {
      upb_StringView source = *(upb_StringView*)value;
      int size = source.size;
      void* cloned_data = upb_Arena_Malloc(arena, size);
      if (cloned_data == NULL) {
        return false;
      }
      *(upb_StringView*)value =
          upb_StringView_FromDataAndSize(cloned_data, size);
      memcpy(cloned_data, source.data, size);
      return true;
    } break;
    case kUpb_CType_Message: {
      const upb_TaggedMessagePtr source = *(upb_TaggedMessagePtr*)value;
      bool is_empty = upb_TaggedMessagePtr_IsEmpty(source);
      if (is_empty) sub = UPB_PRIVATE(_upb_MiniTable_Empty)();
      UPB_ASSERT(source);
      upb_Message* clone = upb_Message_DeepClone(
          UPB_PRIVATE(_upb_TaggedMessagePtr_GetMessage)(source), sub, arena);
      *(upb_TaggedMessagePtr*)value =
          UPB_PRIVATE(_upb_TaggedMessagePtr_Pack)(clone, is_empty);
      return clone != NULL;
    } break;
  }
  UPB_UNREACHABLE();
}